

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.cpp
# Opt level: O1

path * wallet::GetWalletDir(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  path *in_RDI;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff28;
  path local_a8;
  undefined1 local_78 [32];
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(in_RDI);
  paVar1 = &local_58._M_pathname.field_2;
  local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"-walletdir","");
  bVar2 = ArgsManager::IsArgSet(&gArgs,(string *)(local_78 + 0x20));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_pathname._M_dataplus._M_p,
                    local_58._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-walletdir","");
    local_a8._M_pathname.field_2._M_allocated_capacity = 0;
    local_a8._M_pathname.field_2._8_8_ = 0;
    local_a8._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_pathname._M_string_length = 0;
    local_a8._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    std::filesystem::__cxx11::path::path(&local_a8);
    ArgsManager::GetPathArg
              ((path *)(local_78 + 0x20),&gArgs,in_stack_ffffffffffffff28,(path *)local_78);
    if ((path *)(local_78 + 0x20) != in_RDI) {
      GetWalletDir();
    }
    std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x20));
    std::filesystem::__cxx11::path::~path(&local_a8);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    cVar3 = std::filesystem::status((path *)in_RDI);
    if (cVar3 != '\x02') {
      local_58._M_pathname._M_dataplus._M_p = (pointer)((long)"\x05\x04\x03\x02\x01" + 5);
      std::filesystem::__cxx11::path::operator=(in_RDI,(char **)(local_78 + 0x20));
    }
  }
  else {
    ArgsManager::GetDataDir((path *)(local_78 + 0x20),&gArgs,true);
    if ((path *)(local_78 + 0x20) != in_RDI) {
      GetWalletDir();
    }
    std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x20));
    std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff30,in_RDI);
    std::filesystem::__cxx11::path::_M_append(&stack0xffffffffffffff30,7,"wallets");
    std::filesystem::__cxx11::path::path((path *)(local_78 + 0x20),(path *)&stack0xffffffffffffff30)
    ;
    cVar3 = std::filesystem::status((path *)(local_78 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x20));
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff30);
    if (cVar3 == '\x02') {
      std::filesystem::__cxx11::path::_M_append();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetWalletDir()
{
    fs::path path;

    if (gArgs.IsArgSet("-walletdir")) {
        path = gArgs.GetPathArg("-walletdir");
        if (!fs::is_directory(path)) {
            // If the path specified doesn't exist, we return the deliberately
            // invalid empty string.
            path = "";
        }
    } else {
        path = gArgs.GetDataDirNet();
        // If a wallets directory exists, use that, otherwise default to GetDataDir
        if (fs::is_directory(path / "wallets")) {
            path /= "wallets";
        }
    }

    return path;
}